

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_proxy_call(JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,
                     int flags)

{
  JSValue this_obj_00;
  JSValue func_obj_00;
  JSValue func_obj_01;
  JSValue new_target;
  JSValue func_obj_02;
  JSValue JVar1;
  int iVar2;
  JSProxyData *pJVar3;
  JSValueUnion in_RCX;
  undefined8 in_RDX;
  int64_t in_RSI;
  JSContext *in_RDI;
  JSValueUnion in_R8;
  JSValue JVar4;
  uint in_stack_00000010;
  undefined4 in_stack_00000014;
  JSValue args [3];
  JSValue ret;
  JSValue arg_array;
  JSValue method;
  JSProxyData *s;
  JSContext *in_stack_ffffffffffffff20;
  JSValueUnion JVar5;
  JSValue in_stack_ffffffffffffff28;
  uint uStack_c4;
  undefined1 in_stack_ffffffffffffff48 [16];
  undefined1 auVar6 [12];
  JSValueUnion in_stack_ffffffffffffff58;
  JSValue *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  JSContext *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  JSValue *in_stack_ffffffffffffff80;
  JSContext *in_stack_ffffffffffffff88;
  JSValueUnion in_stack_ffffffffffffff90;
  int64_t in_stack_ffffffffffffff98;
  JSValue local_58;
  undefined4 in_stack_fffffffffffffff0;
  int32_t iVar7;
  undefined4 in_stack_fffffffffffffff4;
  int64_t iVar8;
  
  auVar6 = in_stack_ffffffffffffff48._4_12_;
  if ((in_stack_00000010 & 1) == 0) {
    JVar4.tag = in_stack_ffffffffffffff98;
    JVar4.u.ptr = in_stack_ffffffffffffff90.ptr;
    pJVar3 = get_proxy_method(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,JVar4,
                              (JSAtom)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    if (pJVar3 == (JSProxyData *)0x0) {
      iVar7 = 0;
      iVar8 = 6;
    }
    else if (pJVar3->is_func == '\0') {
      JS_FreeValue(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
      JVar4 = JS_ThrowTypeError(in_RDI,"not a function");
      iVar7 = JVar4.u._0_4_;
      in_stack_fffffffffffffff4 = JVar4.u._4_4_;
      iVar8 = JVar4.tag;
    }
    else {
      iVar2 = JS_IsUndefined(local_58);
      if (iVar2 == 0) {
        JVar4 = js_create_array(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                                in_stack_ffffffffffffff60);
        iVar2 = JS_IsException(JVar4);
        if (iVar2 == 0) {
          func_obj_01.tag = (int64_t)in_R8.ptr;
          func_obj_01.u.ptr = in_RCX.ptr;
          in_stack_ffffffffffffff28 =
               JS_Call((JSContext *)JVar4.tag,func_obj_01,pJVar3->target,JVar4.u._4_4_,
                       (JSValue *)in_stack_ffffffffffffff90.ptr);
          JVar5 = in_stack_ffffffffffffff28.u;
          iVar8 = in_stack_ffffffffffffff28.tag;
        }
        else {
          JVar5.ptr = (void *)((ulong)uStack_c4 << 0x20);
          iVar8 = 6;
        }
        JS_FreeValue(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
        JS_FreeValue(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
        iVar7 = JVar5.int32;
        in_stack_fffffffffffffff4 = JVar5._4_4_;
      }
      else {
        func_obj_00.u._4_4_ = in_stack_ffffffffffffff6c;
        func_obj_00.u.int32 = in_stack_ffffffffffffff68;
        func_obj_00.tag = (int64_t)in_stack_ffffffffffffff70;
        this_obj_00.tag = (int64_t)in_stack_ffffffffffffff60;
        this_obj_00.u.float64 = in_stack_ffffffffffffff58.float64;
        JVar4 = JS_Call(auVar6._4_8_,func_obj_00,this_obj_00,auVar6._0_4_,
                        (JSValue *)in_stack_ffffffffffffff90.ptr);
        iVar7 = JVar4.u._0_4_;
        in_stack_fffffffffffffff4 = JVar4.u._4_4_;
        iVar8 = JVar4.tag;
      }
    }
  }
  else {
    func_obj_02.tag._0_4_ = in_stack_fffffffffffffff0;
    func_obj_02.u = (JSValueUnion)in_RDX;
    func_obj_02.tag._4_4_ = in_stack_fffffffffffffff4;
    new_target.tag = in_RSI;
    new_target.u.ptr = in_R8.ptr;
    JVar4 = js_proxy_call_constructor
                      ((JSContext *)in_RCX.ptr,func_obj_02,new_target,(int)((ulong)in_RDI >> 0x20),
                       (JSValue *)CONCAT44(in_stack_00000014,in_stack_00000010));
    iVar7 = JVar4.u._0_4_;
    in_stack_fffffffffffffff4 = JVar4.u._4_4_;
    iVar8 = JVar4.tag;
  }
  JVar1.u._4_4_ = in_stack_fffffffffffffff4;
  JVar1.u.int32 = iVar7;
  JVar1.tag = iVar8;
  return JVar1;
}

Assistant:

static JSValue js_proxy_call(JSContext *ctx, JSValueConst func_obj,
                             JSValueConst this_obj,
                             int argc, JSValueConst *argv, int flags)
{
    JSProxyData *s;
    JSValue method, arg_array, ret;
    JSValueConst args[3];

    if (flags & JS_CALL_FLAG_CONSTRUCTOR)
        return js_proxy_call_constructor(ctx, func_obj, this_obj, argc, argv);
    
    s = get_proxy_method(ctx, &method, func_obj, JS_ATOM_apply);
    if (!s)
        return JS_EXCEPTION;
    if (!s->is_func) {
        JS_FreeValue(ctx, method);
        return JS_ThrowTypeError(ctx, "not a function");
    }
    if (JS_IsUndefined(method))
        return JS_Call(ctx, s->target, this_obj, argc, argv);
    arg_array = js_create_array(ctx, argc, argv);
    if (JS_IsException(arg_array)) {
        ret = JS_EXCEPTION;
        goto fail;
    }
    args[0] = s->target;
    args[1] = this_obj;
    args[2] = arg_array;
    ret = JS_Call(ctx, method, s->handler, 3, args);
 fail:
    JS_FreeValue(ctx, method);
    JS_FreeValue(ctx, arg_array);
    return ret;
}